

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

size_t get_onecapture(MatchState *ms,int i,char *s,char *e,char **cap)

{
  char *pcVar1;
  size_t sStack_20;
  
  if (i < (int)(uint)ms->level) {
    pcVar1 = ms->capture[i].init;
    sStack_20 = ms->capture[i].len;
    *cap = pcVar1;
    if (sStack_20 == 0xfffffffffffffffe) {
      lua_pushinteger(ms->L,(lua_Integer)(pcVar1 + (1 - (long)ms->src_init)));
      sStack_20 = 0xfffffffffffffffe;
    }
    else if (sStack_20 == 0xffffffffffffffff) {
      luaL_error(ms->L,"unfinished capture");
      sStack_20 = 0xffffffffffffffff;
    }
  }
  else {
    if (i != 0) {
      luaL_error(ms->L,"invalid capture index %%%d",(ulong)(i + 1));
    }
    *cap = s;
    sStack_20 = (long)e - (long)s;
  }
  return sStack_20;
}

Assistant:

static size_t get_onecapture (MatchState *ms, int i, const char *s,
                              const char *e, const char **cap) {
  if (i >= ms->level) {
    if (l_unlikely(i != 0))
      luaL_error(ms->L, "invalid capture index %%%d", i + 1);
    *cap = s;
    return e - s;
  }
  else {
    ptrdiff_t capl = ms->capture[i].len;
    *cap = ms->capture[i].init;
    if (l_unlikely(capl == CAP_UNFINISHED))
      luaL_error(ms->L, "unfinished capture");
    else if (capl == CAP_POSITION)
      lua_pushinteger(ms->L, (ms->capture[i].init - ms->src_init) + 1);
    return capl;
  }
}